

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_translate.cpp
# Opt level: O0

void PushIdentityTable(int slot)

{
  FRemapTable *this;
  long lVar1;
  FRemapTablePtr local_30 [3];
  FRemapTable *local_18;
  FRemapTable *table;
  int slot_local;
  
  table._4_4_ = slot;
  this = (FRemapTable *)operator_new(0x20);
  FRemapTable::FRemapTable(this,0x100);
  local_18 = this;
  FRemapTable::MakeIdentity(this);
  lVar1 = (long)table._4_4_;
  FRemapTablePtr::FRemapTablePtr(local_30,local_18);
  TArray<FRemapTablePtr,_FRemapTable_*>::Push
            (&translationtables[lVar1].super_TArray<FRemapTablePtr,_FRemapTable_*>,local_30);
  return;
}

Assistant:

static void PushIdentityTable(int slot)
{
	FRemapTable *table = new FRemapTable;
	table->MakeIdentity();
	translationtables[slot].Push(table);
}